

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_tattle(REF_GEOM ref_geom,REF_INT node)

{
  int iVar1;
  int iVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  printf(" tattle on node = %d\n");
  if (((-1 < node) && (pRVar3 = ref_geom->ref_adj, node < pRVar3->nnode)) &&
     (lVar8 = (long)pRVar3->first[(uint)node], lVar8 != -1)) {
    pRVar5 = pRVar3->item + lVar8;
    while( true ) {
      iVar1 = pRVar5->ref;
      lVar7 = (long)iVar1;
      pRVar4 = ref_geom->descr;
      uVar6 = iVar1 * 6;
      iVar2 = pRVar4[lVar7 * 6];
      if (iVar2 == 2) {
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               ref_geom->param[iVar1 * 2],ref_geom->param[iVar1 * 2 + 1],lVar7,
               (ulong)(uint)pRVar4[(int)(uVar6 | 1)],(ulong)(uint)pRVar4[lVar7 * 6 + 3],
               (ulong)(uint)pRVar4[lVar7 * 6 + 4],(ulong)(uint)pRVar4[lVar7 * 6 + 5]);
      }
      else if (iVar2 == 1) {
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n",ref_geom->param[lVar7 * 2],
               lVar7,(ulong)(uint)pRVar4[(int)(uVar6 | 1)],(ulong)(uint)pRVar4[lVar7 * 6 + 3],
               (ulong)(uint)pRVar4[lVar7 * 6 + 4],(ulong)(uint)pRVar4[lVar7 * 6 + 5]);
      }
      else if (iVar2 == 0) {
        printf("%d node: %d id, %d jump, %d degen, %d global\n",lVar7,
               (ulong)(uint)pRVar4[(int)(uVar6 | 1)],(ulong)(uint)pRVar4[lVar7 * 6 + 3],
               (ulong)(uint)pRVar4[lVar7 * 6 + 4],(ulong)(uint)pRVar4[lVar7 * 6 + 5]);
      }
      pRVar5 = ref_geom->ref_adj->item;
      lVar8 = (long)pRVar5[(int)lVar8].next;
      if (lVar8 == -1) break;
      pRVar5 = pRVar5 + lVar8;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tattle(REF_GEOM ref_geom, REF_INT node) {
  REF_INT item, geom;

  printf(" tattle on node = %d\n", node);
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    switch (ref_geom_type(ref_geom, geom)) {
      case REF_GEOM_NODE:
        printf("%d node: %d id, %d jump, %d degen, %d global\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom));
        break;
      case REF_GEOM_EDGE:
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom));
        break;
      case REF_GEOM_FACE:
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               geom, ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom),
               ref_geom_param(ref_geom, 1, geom));
        break;
    }
  }

  return REF_SUCCESS;
}